

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_block(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *this,size_t node,size_t ilevel,size_t do_indent)

{
  RepC rc;
  RepC rc_00;
  csubstr sp;
  csubstr tag;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  bool bVar1;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  long in_RCX;
  size_t in_RDX;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  Tree *in_RDI;
  bool bVar5;
  size_t next_level;
  bool nl;
  bool spc;
  RepC ind;
  char (*in_stack_fffffffffffffc48) [5];
  char c;
  Tree *in_stack_fffffffffffffc50;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc58;
  Location *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  size_t in_stack_fffffffffffffc70;
  Tree *in_stack_fffffffffffffc98;
  Tree *in_stack_fffffffffffffca0;
  Tree *in_stack_fffffffffffffca8;
  Tree *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  size_t in_stack_fffffffffffffcd0;
  char (*local_2f0) [5];
  Tree *pTStack_2e8;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e0;
  Location *pLStack_2d8;
  char *local_2d0;
  char (*local_2b8) [5];
  Tree *pTStack_2b0;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2a8;
  Location *pLStack_2a0;
  char *local_298;
  char (*in_stack_fffffffffffffd70) [5];
  Tree *in_stack_fffffffffffffd78;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_280;
  Location *pLStack_278;
  char *local_270;
  char (*local_268) [5];
  Tree *pTStack_260;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258;
  Location *pLStack_250;
  char *local_248;
  char (*local_128) [5];
  Tree *pTStack_120;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118;
  Location *pLStack_110;
  char *local_108;
  char (*local_e0) [5];
  Tree *pTStack_d8;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  Location *pLStack_c8;
  char *local_c0;
  NodeData *in_stack_ffffffffffffff68;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  Tree *in_stack_ffffffffffffff78;
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  undefined1 local_30 [8];
  size_t local_28;
  void *local_10;
  undefined1 *local_8;
  
  pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  if (((pNVar4->m_type).type & STREAM) == STREAM) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                       (size_t)in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
    loc.super_LineCol.line = (size_t)in_RDI;
    loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffcb0;
    loc.super_LineCol.col = in_stack_fffffffffffffcc0;
    loc.name.str = (char *)in_stack_fffffffffffffcc8;
    loc.name.len = in_stack_fffffffffffffcd0;
    error<39ul>((char (*) [39])in_stack_fffffffffffffca0,loc);
    in_stack_fffffffffffffc48 = local_268;
    in_stack_fffffffffffffc50 = pTStack_260;
    in_stack_fffffffffffffc58 = local_258;
    in_stack_fffffffffffffc60 = pLStack_250;
    in_stack_fffffffffffffc68 = local_248;
  }
  pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  if ((((pNVar4->m_type).type & (STREAM|MAP)) == NOTYPE) &&
     (pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98),
     ((pNVar4->m_type).type & DOC) == NOTYPE)) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                       (size_t)in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc50 = in_stack_fffffffffffffd78;
    in_stack_fffffffffffffc48 = in_stack_fffffffffffffd70;
    loc_00.super_LineCol.line = (size_t)in_RDI;
    loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffcb0;
    loc_00.super_LineCol.col = in_stack_fffffffffffffcc0;
    loc_00.name.str = (char *)in_stack_fffffffffffffcc8;
    loc_00.name.len = in_stack_fffffffffffffcd0;
    in_stack_fffffffffffffd70 = in_stack_fffffffffffffc48;
    in_stack_fffffffffffffd78 = in_stack_fffffffffffffc50;
    error<65ul>((char (*) [65])in_stack_fffffffffffffca0,loc_00);
    in_stack_fffffffffffffc58 = local_280;
    in_stack_fffffffffffffc60 = pLStack_278;
    in_stack_fffffffffffffc68 = local_270;
  }
  bVar1 = Tree::is_root(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  if (!bVar1) {
    in_stack_fffffffffffffcb0 = (Tree *)in_RDI->m_size;
    bVar1 = Tree::has_parent(in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
    if (!bVar1) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                         (size_t)in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
      loc_01.super_LineCol.line = (size_t)in_RDI;
      loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffcb0;
      loc_01.super_LineCol.col = in_stack_fffffffffffffcc0;
      loc_01.name.str = (char *)in_stack_fffffffffffffcc8;
      loc_01.name.len = in_stack_fffffffffffffcd0;
      error<31ul>((char (*) [31])in_stack_fffffffffffffca0,loc_01);
      in_stack_fffffffffffffc48 = local_128;
      in_stack_fffffffffffffc50 = pTStack_120;
      in_stack_fffffffffffffc58 = local_118;
      in_stack_fffffffffffffc60 = pLStack_110;
      in_stack_fffffffffffffc68 = local_108;
    }
    Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
    pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
    if (((pNVar4->m_type).type & MAP) == NOTYPE) {
      in_stack_fffffffffffffca8 = (Tree *)in_RDI->m_size;
      bVar1 = Tree::has_parent(in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
      if (!bVar1) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                           (size_t)in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
        loc_02.super_LineCol.line = (size_t)in_RDI;
        loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffffcb0;
        loc_02.super_LineCol.col = in_stack_fffffffffffffcc0;
        loc_02.name.str = (char *)in_stack_fffffffffffffcc8;
        loc_02.name.len = in_stack_fffffffffffffcd0;
        error<31ul>((char (*) [31])in_stack_fffffffffffffca0,loc_02);
        in_stack_fffffffffffffc48 = local_e0;
        in_stack_fffffffffffffc50 = pTStack_d8;
        in_stack_fffffffffffffc58 = local_d0;
        in_stack_fffffffffffffc60 = pLStack_c8;
        in_stack_fffffffffffffc68 = local_c0;
      }
      Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      in_stack_ffffffffffffff68 =
           Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      if (((in_stack_ffffffffffffff68->m_type).type & SEQ) == NOTYPE) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                           (size_t)in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
        loc_03.super_LineCol.line = (size_t)in_RDI;
        loc_03.super_LineCol.offset = (size_t)in_stack_fffffffffffffcb0;
        loc_03.super_LineCol.col = in_stack_fffffffffffffcc0;
        loc_03.name.str = (char *)in_stack_fffffffffffffcc8;
        loc_03.name.len = in_stack_fffffffffffffcd0;
        error<100ul>((char (*) [100])in_stack_fffffffffffffca0,loc_03);
        in_stack_fffffffffffffc48 = local_2b8;
        in_stack_fffffffffffffc50 = pTStack_2b0;
        in_stack_fffffffffffffc58 = local_2a8;
        in_stack_fffffffffffffc60 = pLStack_2a0;
        in_stack_fffffffffffffc68 = local_298;
      }
    }
  }
  indent_to(in_RCX * in_RDX);
  pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  if (((pNVar4->m_type).type & DOC) == NOTYPE) {
    pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
    if (((pNVar4->m_type).type & (STREAM|MAP)) != NOTYPE) {
      pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      if ((((pNVar4->m_type).type & MAP) == NOTYPE) &&
         (pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98),
         ((pNVar4->m_type).type & SEQ) == NOTYPE)) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                           (size_t)in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
        loc_04.super_LineCol.line = (size_t)in_RDI;
        loc_04.super_LineCol.offset = (size_t)in_stack_fffffffffffffcb0;
        loc_04.super_LineCol.col = in_stack_fffffffffffffcc0;
        loc_04.name.str = (char *)in_stack_fffffffffffffcc8;
        loc_04.name.len = in_stack_fffffffffffffcd0;
        error<59ul>((char (*) [59])in_stack_fffffffffffffca0,loc_04);
        in_stack_fffffffffffffc48 = local_2f0;
        in_stack_fffffffffffffc50 = pTStack_2e8;
        in_stack_fffffffffffffc58 = local_2e0;
        in_stack_fffffffffffffc60 = pLStack_2d8;
        in_stack_fffffffffffffc68 = local_2d0;
      }
      bVar1 = false;
      pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      if (((pNVar4->m_type).type & KEY) == NOTYPE) {
        bVar2 = Tree::is_root(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
        bVar2 = !bVar2;
        if (bVar2) {
          rc_00.num_times = (size_t)in_stack_fffffffffffffc60;
          rc_00._0_8_ = in_stack_fffffffffffffc58;
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffc50,rc_00);
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffc50,(char)((ulong)in_stack_fffffffffffffc48 >> 0x38))
          ;
        }
      }
      else {
        rc.num_times = (size_t)in_stack_fffffffffffffc60;
        rc._0_8_ = in_stack_fffffffffffffc58;
        in_stack_fffffffffffffc98 = in_RDI;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffc50,rc);
        in_RDI = in_stack_fffffffffffffc98;
        local_28 = in_RDX;
        in_stack_fffffffffffffca0 =
             (Tree *)Tree::keysc(in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
        pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
        local_10 = (void *)((pNVar4->m_type).type & (_WIP_KEY_STYLE|KEYQUO|KEYANCH|KEYREF|KEY));
        local_8 = local_30;
        _write((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc98,(int)in_stack_fffffffffffffca0,local_10,local_28);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffc50,(char)((ulong)in_stack_fffffffffffffc48 >> 0x38));
        bVar2 = true;
      }
      in_stack_ffffffffffffff78 = (Tree *)in_RDI->m_size;
      in_stack_ffffffffffffff70 = in_RSI;
      pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      bVar5 = false;
      if (((pNVar4->m_type).type & VALTAG) != NOTYPE) {
        bVar5 = ((pNVar4->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
      }
      if (bVar5) {
        if (bVar2) {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffc50,(char)((ulong)in_stack_fffffffffffffc48 >> 0x38))
          ;
        }
        Tree::val_tag(in_RDI,(size_t)in_stack_fffffffffffffcb0);
        tag.len = in_stack_fffffffffffffc70;
        tag.str = in_stack_fffffffffffffc68;
        _write_tag((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc60,tag);
        bVar2 = true;
        bVar1 = true;
      }
      pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      bVar5 = false;
      if (((pNVar4->m_type).type & VALANCH) != NOTYPE) {
        bVar5 = ((pNVar4->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
      }
      if (bVar5) {
        if (bVar2) {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffc50,(char)((ulong)in_stack_fffffffffffffc48 >> 0x38))
          ;
        }
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffc50,(char)((ulong)in_stack_fffffffffffffc48 >> 0x38));
        Tree::val_anchor(in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
        sp.len = (size_t)in_stack_fffffffffffffc68;
        sp.str = (char *)in_stack_fffffffffffffc60;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffc58,sp);
        bVar2 = true;
        bVar1 = true;
      }
      bVar5 = Tree::has_children(in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
      if (!bVar5) {
        pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
        if (((pNVar4->m_type).type & SEQ) != NOTYPE) {
          WriterOStream<std::__cxx11::ostringstream>::_do_write<5ul>
                    ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          return;
        }
        pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
        if (((pNVar4->m_type).type & MAP) == NOTYPE) {
          return;
        }
        WriterOStream<std::__cxx11::ostringstream>::_do_write<5ul>
                  ((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        return;
      }
      pNVar4 = Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      c = (char)((ulong)in_stack_fffffffffffffc48 >> 0x38);
      if (((pNVar4->m_type).type & KEY) == NOTYPE) {
        bVar5 = Tree::is_root(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
        if ((!bVar5) && (!bVar1)) {
          bVar2 = true;
        }
      }
      else {
        bVar1 = true;
      }
      if ((bVar2) && (!bVar1)) {
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffc50,c);
      }
      in_stack_ffffffffffffff80 = in_RSI;
      if (bVar1) {
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffc50,c);
        in_stack_ffffffffffffff80 = in_RSI;
      }
    }
  }
  else {
    _write_doc((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
    bVar1 = Tree::has_children(in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
    if (!bVar1) {
      return;
    }
  }
  bVar1 = Tree::is_root(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  if (!bVar1) {
    Tree::_p(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  }
  _do_visit_block_container
            (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
             (size_t)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_block(size_t node, size_t ilevel, size_t do_indent)
{
    RYML_ASSERT(!m_tree->is_stream(node));
    RYML_ASSERT(m_tree->is_container(node) || m_tree->is_doc(node));
    RYML_ASSERT(m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node)));
    RepC ind = indent_to(do_indent * ilevel);

    if(m_tree->is_doc(node))
    {
        _write_doc(node);
        if(!m_tree->has_children(node))
            return;
    }
    else if(m_tree->is_container(node))
    {
        RYML_ASSERT(m_tree->is_map(node) || m_tree->is_seq(node));

        bool spc = false; // write a space
        bool nl = false;  // write a newline

        if(m_tree->has_key(node))
        {
            this->Writer::_do_write(ind);
            _writek(node, ilevel);
            this->Writer::_do_write(':');
            spc = true;
        }
        else if(!m_tree->is_root(node))
        {
            this->Writer::_do_write(ind);
            this->Writer::_do_write('-');
            spc = true;
        }

        if(m_tree->has_val_tag(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_val_anchor(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(node));
            spc = true;
            nl = true;
        }

        if(m_tree->has_children(node))
        {
            if(m_tree->has_key(node))
                nl = true;
            else
                if(!m_tree->is_root(node) && !nl)
                    spc = true;
        }
        else
        {
            if(m_tree->is_seq(node))
                this->Writer::_do_write(" []\n");
            else if(m_tree->is_map(node))
                this->Writer::_do_write(" {}\n");
            return;
        }

        if(spc && !nl)
            this->Writer::_do_write(' ');

        do_indent = 0;
        if(nl)
        {
            this->Writer::_do_write('\n');
            do_indent = 1;
        }
    } // container

    size_t next_level = ilevel + 1;
    if(m_tree->is_root(node) || m_tree->is_doc(node))
        next_level = ilevel; // do not indent at top level

    _do_visit_block_container(node, next_level, do_indent);
}